

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_csp_enc.c
# Opt level: O3

int ImportYUVAFromRGBA(uint8_t *r_ptr,uint8_t *g_ptr,uint8_t *b_ptr,uint8_t *a_ptr,int step,
                      int rgb_stride,float dithering,int use_iterative_conversion,
                      WebPPicture *picture)

{
  fixed_y_t *dst;
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  uint width;
  uint height;
  uint32_t uVar7;
  uint32_t uVar8;
  bool bVar9;
  uint uVar10;
  undefined2 uVar11;
  int i;
  WebPEncCSP WVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  fixed_y_t *dst_00;
  uint16_t *puVar16;
  uint16_t *puVar17;
  uint16_t *ptr;
  int16_t *ptr_00;
  fixed_t *ptr_01;
  fixed_t *dst_01;
  long lVar18;
  _func_void_uint8_t_ptr_uint8_t_ptr_int **pp_Var19;
  ulong uVar20;
  uint64_t uVar21;
  uint uVar22;
  int iVar23;
  ulong uVar24;
  long lVar25;
  ulong uVar26;
  uint8_t *puVar27;
  char cVar28;
  long lVar29;
  uint8_t *puVar30;
  ulong uVar31;
  uint64_t uVar32;
  uint16_t *puVar33;
  long lVar34;
  int v;
  int iVar35;
  uint8_t uVar36;
  int16_t *piVar37;
  uint8_t uVar38;
  uint uVar39;
  uint16_t *puVar40;
  long lVar41;
  int iVar42;
  uint8_t *puVar43;
  uint16_t *puVar44;
  int16_t *piVar45;
  uint uVar46;
  uint16_t *puVar47;
  int iVar48;
  ulong uVar49;
  ulong uVar50;
  VP8Random *rg;
  long lVar51;
  uint32_t *puVar52;
  uint64_t uVar53;
  uint64_t uVar54;
  long lVar55;
  int16_t *piVar56;
  int off;
  int iVar57;
  long lVar58;
  int *piVar59;
  bool bVar60;
  double dVar61;
  undefined1 auVar62 [16];
  fixed_y_t *src2;
  int uv_w;
  VP8Random base_rg;
  uint8_t *local_2d8;
  uint8_t *local_2c0;
  int16_t *local_2b8;
  uint8_t *local_2b0;
  long local_288;
  uint8_t *local_278;
  uint8_t *local_270;
  int16_t *local_268;
  fixed_t *local_238;
  int local_1d0;
  int16_t *local_1c0;
  int16_t *local_1b8;
  uint16_t *local_180;
  VP8Random local_118;
  
  width = picture->width;
  uVar31 = (ulong)width;
  height = picture->height;
  iVar14 = 0;
  bVar60 = true;
  if (a_ptr == (uint8_t *)0x0) {
    WVar12 = WEBP_YUV420;
  }
  else {
    WebPInitAlphaProcessing();
    WVar12 = WEBP_YUV420;
    if (step == 1) {
      if ((int)height < 1) goto LAB_001280bc;
      iVar57 = height + 1;
      puVar30 = a_ptr;
      do {
        iVar13 = (*WebPHasAlpha8b)(puVar30,width);
        bVar60 = iVar13 == 0;
        if (!bVar60) goto LAB_0012809e;
        puVar30 = puVar30 + rgb_stride;
        iVar57 = iVar57 + -1;
      } while (1 < iVar57);
    }
    else {
      if ((int)height < 1) goto LAB_001280bc;
      iVar57 = height + 1;
      puVar30 = a_ptr;
      do {
        iVar13 = (*WebPHasAlpha32b)(puVar30,width);
        bVar60 = iVar13 == 0;
        if (!bVar60) goto LAB_0012809e;
        puVar30 = puVar30 + rgb_stride;
        iVar57 = iVar57 + -1;
      } while (1 < iVar57);
    }
    WVar12 = WEBP_YUV420;
  }
  goto LAB_001280bc;
LAB_0012809e:
  WVar12 = WEBP_CSP_ALPHA_BIT;
LAB_001280bc:
  picture->colorspace = WVar12;
  picture->use_argb = 0;
  iVar57 = WebPPictureAllocYUVA(picture,width,height);
  if (iVar57 != 0) {
    if (((use_iterative_conversion == 0) || ((int)width < 4)) || ((int)height < 4)) {
      uVar39 = (int)(width + 1) >> 1;
      puVar16 = (uint16_t *)WebPSafeMalloc((long)(int)(uVar39 * 4),2);
      local_2b0 = picture->y;
      local_2b8 = (int16_t *)picture->u;
      local_2c0 = picture->v;
      local_270 = picture->a;
      rg = (VP8Random *)0x0;
      bVar9 = dithering <= 0.0;
      if (bVar9) {
        puVar52 = (uint32_t *)0x8;
      }
      else {
        puVar52 = local_118.tab_;
        rg = &local_118;
        VP8InitRandom(rg,dithering);
      }
      WebPInitConvertARGBToYUV();
      iVar14 = pthread_mutex_lock((pthread_mutex_t *)InitGammaTables_InitGammaTables_body_lock);
      if (iVar14 == 0) {
        if (((VP8CPUInfo)InitGammaTables_InitGammaTables_body_last_cpuinfo_used != VP8GetCPUInfo) &&
           (kGammaTablesOk == 0)) {
          puVar17 = kGammaToLinearTab;
          lVar58 = 0;
          do {
            dVar61 = pow((double)(int)lVar58 * 0.00392156862745098,0.8);
            *puVar17 = (uint16_t)(int)(dVar61 * 4095.0 + 0.5);
            lVar58 = lVar58 + 1;
            puVar17 = puVar17 + 1;
          } while (lVar58 != 0x100);
          piVar59 = kLinearToGammaTab;
          lVar58 = 0;
          do {
            dVar61 = pow((double)(int)lVar58 * 0.03125763125763126,1.25);
            *piVar59 = (int)(dVar61 * 255.0 + 0.5);
            lVar58 = lVar58 + 1;
            piVar59 = piVar59 + 1;
          } while (lVar58 != 0x21);
          kGammaTablesOk = 1;
        }
        InitGammaTables_InitGammaTables_body_last_cpuinfo_used = VP8GetCPUInfo;
        pthread_mutex_unlock((pthread_mutex_t *)InitGammaTables_InitGammaTables_body_lock);
      }
      if (puVar16 == (uint16_t *)0x0) {
        return 0;
      }
      puVar30 = b_ptr;
      local_2d8 = r_ptr;
      local_278 = a_ptr;
      if (0 < (int)height >> 1) {
        lVar18 = (long)(rgb_stride * 2);
        iVar14 = 0;
        lVar58 = 0;
        if (!bVar60) {
          lVar58 = lVar18;
        }
        if (r_ptr < b_ptr) {
          pp_Var19 = &WebPConvertRGB24ToY;
        }
        else {
          pp_Var19 = &WebPConvertBGR24ToY;
        }
        do {
          if (!bVar9 || step != 3) {
            if (0 < (int)width) {
              uVar49 = 0;
              lVar25 = 0;
              do {
                bVar1 = local_2d8[lVar25];
                bVar2 = g_ptr[lVar25];
                bVar3 = puVar30[lVar25];
                if (rg == (VP8Random *)0x0) {
                  iVar57 = (uint)bVar2 * 0x8123 + (uint)bVar1 * 0x41c7 + (uint)bVar3 * 0x1914;
                }
                else {
                  uVar7 = puVar52[rg->index1_];
                  uVar8 = puVar52[rg->index2_];
                  iVar57 = rg->amp_;
                  puVar52[rg->index1_] = uVar7 - uVar8 & 0x7fffffff;
                  iVar13 = rg->index1_ + 1;
                  if (iVar13 == 0x37) {
                    iVar13 = 0;
                  }
                  rg->index1_ = iVar13;
                  iVar13 = rg->index2_ + 1;
                  if (iVar13 == 0x37) {
                    iVar13 = 0;
                  }
                  rg->index2_ = iVar13;
                  iVar57 = ((short)(uVar7 - uVar8 >> 0xf) * iVar57 >> 8) +
                           (uint)bVar3 * 0x1914 + (uint)bVar2 * 0x8123 + (uint)bVar1 * 0x41c7;
                }
                local_2b0[uVar49] = (uint8_t)((uint)(iVar57 + 0x108000) >> 0x10);
                uVar49 = uVar49 + 1;
                lVar25 = lVar25 + step;
              } while (uVar31 != uVar49);
              iVar57 = picture->y_stride;
              uVar49 = 0;
              lVar25 = (long)rgb_stride;
              do {
                bVar1 = local_2d8[lVar25];
                bVar2 = g_ptr[lVar25];
                bVar3 = puVar30[lVar25];
                if (rg == (VP8Random *)0x0) {
                  iVar13 = (uint)bVar3 * 0x1914 + (uint)bVar2 * 0x8123 + (uint)bVar1 * 0x41c7;
                }
                else {
                  uVar7 = puVar52[rg->index1_];
                  uVar8 = puVar52[rg->index2_];
                  iVar13 = rg->amp_;
                  puVar52[rg->index1_] = uVar7 - uVar8 & 0x7fffffff;
                  iVar48 = rg->index1_ + 1;
                  if (iVar48 == 0x37) {
                    iVar48 = 0;
                  }
                  rg->index1_ = iVar48;
                  iVar48 = rg->index2_ + 1;
                  if (iVar48 == 0x37) {
                    iVar48 = 0;
                  }
                  rg->index2_ = iVar48;
                  iVar13 = (uint)bVar3 * 0x1914 + (uint)bVar2 * 0x8123 + (uint)bVar1 * 0x41c7 +
                           ((short)(uVar7 - uVar8 >> 0xf) * iVar13 >> 8);
                }
                local_2b0[uVar49 + (long)iVar57] = (uint8_t)((uint)(iVar13 + 0x108000) >> 0x10);
                uVar49 = uVar49 + 1;
                lVar25 = lVar25 + step;
              } while (uVar31 != uVar49);
            }
          }
          else {
            puVar27 = puVar30;
            if (r_ptr < b_ptr) {
              puVar27 = local_2d8;
            }
            (**pp_Var19)(puVar27,local_2b0,width);
            (**pp_Var19)(puVar27 + rgb_stride,local_2b0 + picture->y_stride,width);
          }
          iVar57 = picture->y_stride;
          if (bVar60) {
LAB_00128ee2:
            AccumulateRGB(local_2d8,g_ptr,puVar30,step,rgb_stride,puVar16,width);
          }
          else {
            iVar13 = (*WebPExtractAlpha)(local_278,rgb_stride,width,2,local_270,picture->a_stride);
            local_270 = local_270 + (long)picture->a_stride * 2;
            if (iVar13 != 0) goto LAB_00128ee2;
            AccumulateRGBA(local_2d8,g_ptr,puVar30,local_278,rgb_stride,puVar16,width);
          }
          if (rg == (VP8Random *)0x0) {
            (*WebPConvertRGBA32ToUV)(puVar16,(uint8_t *)local_2b8,local_2c0,uVar39);
          }
          else if (0 < (int)uVar39) {
            uVar49 = 0;
            do {
              uVar4 = puVar16[uVar49 * 4];
              uVar5 = puVar16[uVar49 * 4 + 1];
              uVar6 = puVar16[uVar49 * 4 + 2];
              uVar7 = puVar52[rg->index1_];
              uVar8 = puVar52[rg->index2_];
              iVar13 = rg->amp_;
              puVar52[rg->index1_] = uVar7 - uVar8 & 0x7fffffff;
              iVar48 = rg->index1_ + 1;
              if (iVar48 == 0x37) {
                iVar48 = 0;
              }
              iVar23 = rg->index2_ + 1;
              if (iVar23 == 0x37) {
                iVar23 = 0;
              }
              rg->index1_ = iVar48;
              rg->index2_ = iVar23;
              iVar13 = (uint)uVar6 * 0x7080 + (uint)uVar5 * -0x4a89 + (uint)uVar4 * -0x25f7 +
                       0x2020000 + (((int)((uVar7 - uVar8) * 2) >> 0xe) * iVar13 >> 8);
              if (iVar13 >> 0x12 < 1) {
                iVar13 = 0;
              }
              iVar13 = iVar13 >> 0x12;
              if (0xfe < iVar13) {
                iVar13 = 0xff;
              }
              *(uint8_t *)((long)local_2b8 + uVar49) = (uint8_t)iVar13;
              uVar7 = puVar52[rg->index1_];
              uVar8 = puVar52[rg->index2_];
              iVar13 = rg->amp_;
              puVar52[rg->index1_] = uVar7 - uVar8 & 0x7fffffff;
              iVar48 = rg->index1_ + 1;
              if (iVar48 == 0x37) {
                iVar48 = 0;
              }
              iVar23 = rg->index2_ + 1;
              if (iVar23 == 0x37) {
                iVar23 = 0;
              }
              rg->index1_ = iVar48;
              rg->index2_ = iVar23;
              iVar13 = (uint)uVar6 * -0x124c + (uint)uVar5 * -0x5e34 + (uint)uVar4 * 0x7080 +
                       0x2020000 + (((int)((uVar7 - uVar8) * 2) >> 0xe) * iVar13 >> 8);
              if (iVar13 >> 0x12 < 1) {
                iVar13 = 0;
              }
              iVar13 = iVar13 >> 0x12;
              if (0xfe < iVar13) {
                iVar13 = 0xff;
              }
              local_2c0[uVar49] = (uint8_t)iVar13;
              uVar49 = uVar49 + 1;
            } while (uVar39 != uVar49);
          }
          local_2b0 = local_2b0 + (long)iVar57 * 2;
          local_2b8 = (int16_t *)((long)local_2b8 + (long)picture->uv_stride);
          local_2c0 = local_2c0 + picture->uv_stride;
          local_2d8 = local_2d8 + lVar18;
          puVar30 = puVar30 + lVar18;
          g_ptr = g_ptr + lVar18;
          local_278 = local_278 + lVar58;
          iVar14 = iVar14 + 1;
        } while (iVar14 != (int)height >> 1);
      }
      if ((height & 1) != 0) {
        if (!bVar9 || step != 3) {
          if (0 < (int)width) {
            uVar49 = 0;
            lVar58 = 0;
            do {
              bVar1 = local_2d8[lVar58];
              bVar2 = g_ptr[lVar58];
              bVar3 = puVar30[lVar58];
              if (rg == (VP8Random *)0x0) {
                iVar14 = (uint)bVar3 * 0x1914 + (uint)bVar2 * 0x8123 + (uint)bVar1 * 0x41c7;
              }
              else {
                uVar7 = puVar52[rg->index1_];
                uVar8 = puVar52[rg->index2_];
                iVar14 = rg->amp_;
                puVar52[rg->index1_] = uVar7 - uVar8 & 0x7fffffff;
                iVar57 = rg->index1_ + 1;
                if (iVar57 == 0x37) {
                  iVar57 = 0;
                }
                rg->index1_ = iVar57;
                iVar57 = rg->index2_ + 1;
                if (iVar57 == 0x37) {
                  iVar57 = 0;
                }
                rg->index2_ = iVar57;
                iVar14 = (uint)bVar3 * 0x1914 + (uint)bVar2 * 0x8123 + (uint)bVar1 * 0x41c7 +
                         ((short)(uVar7 - uVar8 >> 0xf) * iVar14 >> 8);
              }
              local_2b0[uVar49] = (uint8_t)((uint)(iVar14 + 0x108000) >> 0x10);
              uVar49 = uVar49 + 1;
              lVar58 = lVar58 + step;
            } while (uVar31 != uVar49);
          }
        }
        else {
          puVar27 = puVar30;
          if (local_2d8 < puVar30) {
            puVar27 = local_2d8;
          }
          pp_Var19 = &WebPConvertBGR24ToY;
          if (local_2d8 < puVar30) {
            pp_Var19 = &WebPConvertRGB24ToY;
          }
          (**pp_Var19)(puVar27,local_2b0,width);
        }
        if ((bVar60) || (iVar14 = (*WebPExtractAlpha)(local_278,0,width,1,local_270,0), iVar14 != 0)
           ) {
          AccumulateRGB(local_2d8,g_ptr,puVar30,step,0,puVar16,width);
        }
        else {
          AccumulateRGBA(local_2d8,g_ptr,puVar30,local_278,0,puVar16,width);
        }
        if (rg == (VP8Random *)0x0) {
          (*WebPConvertRGBA32ToUV)(puVar16,(uint8_t *)local_2b8,local_2c0,uVar39);
        }
        else if (0 < (int)uVar39) {
          uVar31 = 0;
          do {
            uVar4 = puVar16[uVar31 * 4];
            uVar5 = puVar16[uVar31 * 4 + 1];
            uVar6 = puVar16[uVar31 * 4 + 2];
            uVar7 = puVar52[rg->index1_];
            uVar8 = puVar52[rg->index2_];
            iVar14 = rg->amp_;
            puVar52[rg->index1_] = uVar7 - uVar8 & 0x7fffffff;
            iVar57 = rg->index1_ + 1;
            if (iVar57 == 0x37) {
              iVar57 = 0;
            }
            iVar13 = rg->index2_ + 1;
            if (iVar13 == 0x37) {
              iVar13 = 0;
            }
            rg->index1_ = iVar57;
            rg->index2_ = iVar13;
            iVar14 = (uint)uVar6 * 0x7080 + (uint)uVar5 * -0x4a89 + (uint)uVar4 * -0x25f7 +
                     0x2020000 + (((int)((uVar7 - uVar8) * 2) >> 0xe) * iVar14 >> 8);
            if (iVar14 >> 0x12 < 1) {
              iVar14 = 0;
            }
            iVar14 = iVar14 >> 0x12;
            if (0xfe < iVar14) {
              iVar14 = 0xff;
            }
            *(uint8_t *)((long)local_2b8 + uVar31) = (uint8_t)iVar14;
            uVar7 = puVar52[rg->index1_];
            uVar8 = puVar52[rg->index2_];
            iVar14 = rg->amp_;
            puVar52[rg->index1_] = uVar7 - uVar8 & 0x7fffffff;
            iVar57 = rg->index1_ + 1;
            if (iVar57 == 0x37) {
              iVar57 = 0;
            }
            iVar13 = rg->index2_ + 1;
            if (iVar13 == 0x37) {
              iVar13 = 0;
            }
            rg->index1_ = iVar57;
            rg->index2_ = iVar13;
            iVar14 = (uint)uVar6 * -0x124c + (uint)uVar5 * -0x5e34 + (uint)uVar4 * 0x7080 +
                     0x2020000 + (((int)((uVar7 - uVar8) * 2) >> 0xe) * iVar14 >> 8);
            if (iVar14 >> 0x12 < 1) {
              iVar14 = 0;
            }
            iVar14 = iVar14 >> 0x12;
            if (0xfe < iVar14) {
              iVar14 = 0xff;
            }
            local_2c0[uVar31] = (uint8_t)iVar14;
            uVar31 = uVar31 + 1;
          } while (uVar39 != uVar31);
        }
      }
      WebPSafeFree(puVar16);
    }
    else {
      iVar14 = pthread_mutex_lock((pthread_mutex_t *)InitGammaTablesS_InitGammaTablesS_body_lock);
      if (iVar14 == 0) {
        if (((VP8CPUInfo)InitGammaTablesS_InitGammaTablesS_body_last_cpuinfo_used != VP8GetCPUInfo)
           && (kGammaTablesSOk == 0)) {
          puVar52 = kGammaToLinearTabS;
          lVar58 = 0;
          do {
            dVar61 = (double)(int)lVar58 * 0.0009775171065493646;
            if (dVar61 <= 0.08124285829863151) {
              dVar61 = dVar61 / 4.5;
            }
            else {
              dVar61 = pow((dVar61 + 0.09929682680944) * 0.909672415686275,2.2222222222222223);
            }
            *puVar52 = (uint32_t)(long)(dVar61 * 16384.0 + 0.5);
            lVar58 = lVar58 + 1;
            puVar52 = puVar52 + 1;
          } while (lVar58 != 0x400);
          puVar52 = kLinearToGammaTabS;
          lVar58 = 0;
          do {
            dVar61 = (double)(int)lVar58 * 0.03125;
            if (dVar61 <= 0.018053968510807) {
              dVar61 = dVar61 * 4.5;
            }
            else {
              dVar61 = pow(dVar61,0.44999999999999996);
              dVar61 = dVar61 * 1.09929682680944 + -0.09929682680944;
            }
            *puVar52 = (int)(long)(dVar61 * 1023.0) + 0x2000;
            lVar58 = lVar58 + 1;
            puVar52 = puVar52 + 1;
          } while (lVar58 != 0x21);
          kLinearToGammaTabS[0x21] = kLinearToGammaTabS[0x20];
          kGammaTablesSOk = 1;
        }
        InitGammaTablesS_InitGammaTablesS_body_last_cpuinfo_used = VP8GetCPUInfo;
        pthread_mutex_unlock((pthread_mutex_t *)InitGammaTablesS_InitGammaTablesS_body_lock);
      }
      uVar49 = (long)picture->width + 1;
      uVar31 = (long)picture->height + 1;
      uVar50 = uVar31 & 0xfffffffffffffffe;
      iVar48 = (int)uVar49 >> 1;
      iVar14 = (int)(uVar49 & 0xfffffffffffffffe);
      uVar39 = iVar14 * 2;
      dst_00 = (fixed_y_t *)WebPSafeMalloc((long)(iVar14 * 6),2);
      uVar53 = (uVar49 & 0xfffffffffffffffe) * uVar50;
      puVar16 = (uint16_t *)WebPSafeMalloc(uVar53,2);
      puVar17 = (uint16_t *)WebPSafeMalloc(uVar53,2);
      uVar53 = (uint64_t)(int)uVar39;
      ptr = (uint16_t *)WebPSafeMalloc(uVar53,2);
      iVar57 = iVar48 * 3;
      uVar54 = (uint64_t)(((int)uVar31 >> 1) * iVar57);
      ptr_00 = (int16_t *)WebPSafeMalloc(uVar54,2);
      ptr_01 = (fixed_t *)WebPSafeMalloc(uVar54,2);
      uVar54 = (uint64_t)iVar57;
      dst_01 = (fixed_t *)WebPSafeMalloc(uVar54,2);
      auVar62._0_4_ = -(uint)((int)((ulong)puVar16 >> 0x20) == 0 && (int)puVar16 == 0);
      auVar62._4_4_ = -(uint)((int)ptr_00 == 0 && (int)((ulong)ptr_00 >> 0x20) == 0);
      auVar62._8_4_ = -(uint)((int)puVar17 == 0 && (int)((ulong)puVar17 >> 0x20) == 0);
      auVar62._12_4_ = -(uint)((int)ptr_01 == 0 && (int)((ulong)ptr_01 >> 0x20) == 0);
      iVar13 = movmskps((int)dst_01,auVar62);
      if ((((iVar13 == 0) && (ptr != (uint16_t *)0x0)) && (dst_01 != (fixed_t *)0x0)) &&
         (dst_00 != (fixed_y_t *)0x0)) {
        local_1d0 = (int)uVar50;
        dVar61 = (double)local_1d0 * (double)iVar14 * 3.0;
        uVar31 = (ulong)dVar61;
        WebPInitConvertARGBToYUV();
        iVar13 = picture->height;
        lVar58 = (long)(iVar14 * 3);
        dst = dst_00 + lVar58;
        uVar50 = uVar49 & 0xfffffffe;
        uVar32 = uVar53;
        if (0 < iVar13) {
          uVar32 = (uint64_t)uVar39;
          iVar23 = rgb_stride * 2;
          uVar49 = uVar49 >> 1 & 0x7fffffff;
          puVar33 = puVar16 + uVar49 * 2;
          puVar40 = puVar17 + uVar49 * 2;
          iVar42 = 0;
          puVar44 = puVar17;
          puVar47 = puVar16;
          local_268 = ptr_00;
          local_238 = ptr_01;
          do {
            ImportOneRow(r_ptr,g_ptr,b_ptr,step,picture->width,dst_00);
            if (iVar42 == iVar13 + -1) {
              memcpy(dst,dst_00,lVar58 * 2);
            }
            else {
              ImportOneRow(r_ptr + rgb_stride,g_ptr + rgb_stride,b_ptr + rgb_stride,step,
                           picture->width,dst);
            }
            if (0 < iVar14) {
              uVar49 = 0;
              do {
                puVar47[uVar49] =
                     (uint16_t)
                     ((uint)dst_00[uVar32 + uVar49] * 0x127c +
                      (uint)dst_00[uVar50 + uVar49] * 0xb717 + (uint)dst_00[uVar49] * 0x366d +
                      0x8000 >> 0x10);
                uVar49 = uVar49 + 1;
              } while (uVar50 != uVar49);
              uVar49 = 0;
              do {
                puVar33[uVar49] =
                     (uint16_t)
                     ((uint)dst[uVar32 + uVar49] * 0x127c +
                      (uint)dst[uVar50 + uVar49] * 0xb717 + (uint)dst[uVar49] * 0x366d + 0x8000 >>
                     0x10);
                uVar49 = uVar49 + 1;
              } while (uVar50 != uVar49);
              uVar49 = 0;
              do {
                uVar22 = (int)(kGammaToLinearTabS[dst_00[uVar32 + uVar49]] * 0x127c +
                               kGammaToLinearTabS[dst_00[uVar50 + uVar49]] * 0xb717 +
                               kGammaToLinearTabS[dst_00[uVar49]] * 0x366d + 0x8000) >> 0xb;
                uVar24 = (ulong)(uVar22 >> 0xe);
                puVar44[uVar49] =
                     (short)((kLinearToGammaTabS[uVar24 + 1] - kLinearToGammaTabS[uVar24]) *
                             (uVar22 & 0x3fe0) >> 0xe) + (short)kLinearToGammaTabS[uVar24];
                uVar49 = uVar49 + 1;
              } while (uVar50 != uVar49);
              uVar49 = 0;
              do {
                uVar22 = (int)(kGammaToLinearTabS[dst[uVar32 + uVar49]] * 0x127c +
                               kGammaToLinearTabS[dst[uVar50 + uVar49]] * 0xb717 +
                               kGammaToLinearTabS[dst[uVar49]] * 0x366d + 0x8000) >> 0xb;
                uVar24 = (ulong)(uVar22 >> 0xe);
                puVar40[uVar49] =
                     (short)((kLinearToGammaTabS[uVar24 + 1] - kLinearToGammaTabS[uVar24]) *
                             (uVar22 & 0x3fe0) >> 0xe) + (short)kLinearToGammaTabS[uVar24];
                uVar49 = uVar49 + 1;
              } while (uVar50 != uVar49);
            }
            UpdateChroma(dst_00,dst,local_238,iVar48);
            memcpy(local_268,local_238,uVar54 * 2);
            local_268 = local_268 + uVar54;
            local_238 = local_238 + uVar54;
            r_ptr = r_ptr + iVar23;
            g_ptr = g_ptr + iVar23;
            b_ptr = b_ptr + iVar23;
            iVar42 = iVar42 + 2;
            iVar13 = picture->height;
            puVar47 = puVar47 + uVar53;
            puVar33 = puVar33 + uVar53;
            puVar44 = puVar44 + uVar53;
            puVar40 = puVar40 + uVar53;
          } while (iVar42 < iVar13);
        }
        lVar41 = (long)iVar14;
        iVar13 = iVar14 + -1 >> 1;
        lVar18 = (long)iVar48 * 2 + -2;
        lVar25 = lVar41 * 2;
        uVar49 = 0xffffffffffffffff;
        uVar22 = 0;
        do {
          uVar46 = uVar22;
          uVar24 = uVar49;
          if (local_1d0 < 1) {
            uVar49 = 0;
          }
          else {
            uVar49 = 0;
            iVar23 = 0;
            puVar33 = puVar16;
            piVar37 = ptr_00;
            local_2b8 = ptr_00;
            local_1c0 = ptr_00;
            local_1b8 = ptr_01;
            local_180 = puVar17;
            do {
              piVar45 = piVar37;
              iVar42 = 0;
              if (iVar23 < local_1d0 + -2) {
                iVar42 = iVar57;
              }
              piVar37 = piVar45 + iVar42;
              iVar35 = -3;
              lVar34 = 0;
              lVar51 = 0;
              lVar29 = lVar58 * 2 + (long)(iVar14 + -2) * 2 + 2;
              lVar55 = lVar58 * 2;
              local_288 = (long)(iVar14 + -2) * 2 + 2;
              do {
                iVar15 = (*(short *)((long)piVar45 + lVar51) * 3 +
                          (int)*(short *)((long)local_2b8 + lVar51) + 2 >> 2) + (uint)*puVar33;
                if (iVar15 < 1) {
                  iVar15 = 0;
                }
                uVar11 = (undefined2)iVar15;
                if (0x3fe < iVar15) {
                  uVar11 = 0x3ff;
                }
                *(undefined2 *)((long)dst_00 + lVar34) = uVar11;
                iVar15 = (*(short *)((long)piVar45 + lVar51) * 3 +
                          (int)*(short *)((long)piVar37 + lVar51) + 2 >> 2) + (uint)puVar33[lVar41];
                if (iVar15 < 1) {
                  iVar15 = 0;
                }
                if (0x3fe < iVar15) {
                  iVar15 = 0x3ff;
                }
                *(short *)((long)dst_00 + lVar55) = (short)iVar15;
                (*WebPSharpYUVFilterRow)
                          ((int16_t *)((long)piVar45 + lVar51),(int16_t *)((long)local_2b8 + lVar51)
                           ,iVar13,puVar33 + 1,(uint16_t *)((long)dst_00 + lVar34 + 2));
                (*WebPSharpYUVFilterRow)
                          ((int16_t *)((long)piVar45 + lVar51),(int16_t *)((long)piVar37 + lVar51),
                           iVar13,puVar33 + lVar41 + 1,(uint16_t *)((long)dst_00 + lVar55 + 2));
                iVar15 = (*(short *)((long)piVar45 + lVar51 + lVar18) * 3 +
                          (int)*(short *)((long)local_2b8 + lVar51 + lVar18) + 2 >> 2) +
                         (uint)puVar33[iVar14 + -1];
                if (iVar15 < 1) {
                  iVar15 = 0;
                }
                uVar11 = (undefined2)iVar15;
                if (0x3fe < iVar15) {
                  uVar11 = 0x3ff;
                }
                *(undefined2 *)((long)dst_00 + local_288) = uVar11;
                iVar15 = (*(short *)((long)piVar45 + lVar51 + lVar18) * 3 +
                          (int)*(short *)((long)piVar45 + lVar51 + (long)iVar42 * 2 + lVar18) + 2 >>
                         2) + (uint)puVar33[iVar14 * 2 + -1];
                if (iVar15 < 1) {
                  iVar15 = 0;
                }
                if (0x3fe < iVar15) {
                  iVar15 = 0x3ff;
                }
                *(short *)((long)dst_00 + lVar29) = (short)iVar15;
                lVar51 = lVar51 + (long)iVar48 * 2;
                lVar29 = lVar29 + lVar25;
                lVar55 = lVar55 + lVar25;
                local_288 = local_288 + lVar25;
                lVar34 = lVar34 + lVar25;
                iVar35 = iVar35 + 1;
              } while (iVar35 != 0);
              if (0 < iVar14) {
                uVar20 = 0;
                do {
                  uVar22 = (int)(kGammaToLinearTabS[dst_00[uVar32 + uVar20]] * 0x127c +
                                 kGammaToLinearTabS[dst_00[uVar50 + uVar20]] * 0xb717 +
                                 kGammaToLinearTabS[dst_00[uVar20]] * 0x366d + 0x8000) >> 0xb;
                  uVar26 = (ulong)(uVar22 >> 0xe);
                  ptr[uVar20] = (short)((kLinearToGammaTabS[uVar26 + 1] - kLinearToGammaTabS[uVar26]
                                        ) * (uVar22 & 0x3fe0) >> 0xe) +
                                (short)kLinearToGammaTabS[uVar26];
                  uVar20 = uVar20 + 1;
                } while (uVar50 != uVar20);
                uVar20 = 0;
                do {
                  uVar22 = (int)(kGammaToLinearTabS[dst[uVar32 + uVar20]] * 0x127c +
                                 kGammaToLinearTabS[dst[uVar50 + uVar20]] * 0xb717 +
                                 kGammaToLinearTabS[dst[uVar20]] * 0x366d + 0x8000) >> 0xb;
                  uVar26 = (ulong)(uVar22 >> 0xe);
                  ptr[lVar41 + uVar20] =
                       (short)((kLinearToGammaTabS[uVar26 + 1] - kLinearToGammaTabS[uVar26]) *
                               (uVar22 & 0x3fe0) >> 0xe) + (short)kLinearToGammaTabS[uVar26];
                  uVar20 = uVar20 + 1;
                } while (uVar50 != uVar20);
              }
              UpdateChroma(dst_00,dst,dst_01,iVar48);
              uVar21 = (*WebPSharpYUVUpdateY)(local_180,ptr,puVar33,uVar39);
              uVar49 = uVar49 + uVar21;
              (*WebPSharpYUVUpdateRGB)(local_1b8,dst_01,local_1c0,iVar57);
              puVar33 = puVar33 + uVar53;
              local_1c0 = local_1c0 + uVar54;
              local_180 = local_180 + uVar53;
              local_1b8 = local_1b8 + uVar54;
              iVar23 = iVar23 + 2;
              local_2b8 = piVar45;
            } while (iVar23 < local_1d0);
          }
          uVar22 = 1;
        } while ((uVar46 == 0) ||
                ((((uVar31 | (long)(dVar61 - 9.223372036854776e+18) & (long)uVar31 >> 0x3f) <=
                   uVar49 && (uVar49 <= uVar24)) && (uVar22 = uVar46 + 1, uVar46 < 3))));
        puVar30 = picture->u;
        puVar27 = picture->v;
        uVar31 = (ulong)(uint)picture->width;
        iVar14 = picture->height;
        uVar22 = picture->width + 1;
        uVar39 = uVar22 & 0xfffffffe;
        uVar22 = (int)uVar22 >> 1;
        iVar57 = iVar14 + 1 >> 1;
        if (0 < iVar14) {
          puVar43 = picture->y;
          uVar46 = 0;
          puVar33 = puVar16;
          piVar37 = ptr_00;
          do {
            if (0 < (int)uVar31) {
              uVar49 = 0;
              do {
                uVar10 = (uint)(uVar49 >> 1) & 0x7fffffff;
                iVar14 = (int)(((int)piVar37[(int)(uVar10 + uVar39)] + (uint)puVar33[uVar49]) *
                               0x1914 + piVar37[(int)(uVar10 + uVar22)] * 0x8123 +
                                        (uint)puVar33[uVar49] * 0xc2ea +
                                        *(short *)((long)piVar37 +
                                                  (ulong)((uint)uVar49 & 0xfffffffe)) * 0x41c7 +
                              0x20000) >> 0x12;
                uVar10 = iVar14 + 0x10;
                uVar36 = -(-0x11 < iVar14);
                if ((uVar10 & 0xffff) < 0x100) {
                  uVar36 = (uint8_t)uVar10;
                }
                puVar43[uVar49] = uVar36;
                uVar49 = uVar49 + 1;
                uVar31 = (ulong)picture->width;
              } while ((long)uVar49 < (long)uVar31);
              iVar14 = picture->height;
            }
            piVar37 = piVar37 + (int)((uVar46 & 1) * uVar22 * 3);
            puVar43 = puVar43 + picture->y_stride;
            uVar46 = uVar46 + 1;
            puVar33 = puVar33 + (int)uVar39;
          } while ((int)uVar46 < iVar14);
        }
        if (0 < iVar57) {
          iVar14 = uVar22 * 3;
          piVar37 = ptr_00 + (int)uVar39;
          piVar45 = ptr_00 + (int)uVar22;
          iVar13 = 0;
          piVar56 = ptr_00;
          do {
            if (0 < (int)uVar22) {
              uVar31 = 0;
              do {
                iVar48 = piVar37[uVar31] * 0x7080 + 0x20000 +
                         piVar45[uVar31] * -0x4a89 + piVar56[uVar31] * -0x25f7;
                iVar23 = iVar48 >> 0x12;
                cVar28 = (char)iVar23;
                uVar36 = -(-0x81 < iVar23);
                if ((short)cVar28 == (short)(iVar48 >> 0x12)) {
                  uVar36 = cVar28 + 0x80;
                }
                iVar48 = piVar37[uVar31] * -0x124c + 0x20000 +
                         piVar45[uVar31] * -0x5e34 + piVar56[uVar31] * 0x7080;
                iVar23 = iVar48 >> 0x12;
                cVar28 = (char)iVar23;
                uVar38 = -(-0x81 < iVar23);
                if ((short)cVar28 == (short)(iVar48 >> 0x12)) {
                  uVar38 = cVar28 + 0x80;
                }
                puVar30[uVar31] = uVar36;
                puVar27[uVar31] = uVar38;
                uVar31 = uVar31 + 1;
              } while (uVar22 != uVar31);
            }
            puVar30 = puVar30 + picture->uv_stride;
            puVar27 = puVar27 + picture->uv_stride;
            iVar13 = iVar13 + 1;
            piVar37 = piVar37 + iVar14;
            piVar45 = piVar45 + iVar14;
            piVar56 = piVar56 + iVar14;
          } while (iVar13 != iVar57);
        }
        WebPSafeFree(puVar16);
        WebPSafeFree(ptr_00);
        WebPSafeFree(puVar17);
        WebPSafeFree(ptr_01);
        WebPSafeFree(ptr);
        WebPSafeFree(dst_01);
        WebPSafeFree(dst_00);
        if (bVar60) {
          return 1;
        }
      }
      else {
        iVar14 = WebPEncodingSetError(picture,VP8_ENC_ERROR_OUT_OF_MEMORY);
        WebPSafeFree(puVar16);
        WebPSafeFree(ptr_00);
        WebPSafeFree(puVar17);
        WebPSafeFree(ptr_01);
        WebPSafeFree(ptr);
        WebPSafeFree(dst_01);
        WebPSafeFree(dst_00);
        if (iVar14 == 0 || bVar60) {
          return (uint)(iVar14 != 0);
        }
      }
      (*WebPExtractAlpha)(a_ptr,rgb_stride,width,height,picture->a,picture->a_stride);
    }
    iVar14 = 1;
  }
  return iVar14;
}

Assistant:

static int ImportYUVAFromRGBA(const uint8_t* r_ptr,
                              const uint8_t* g_ptr,
                              const uint8_t* b_ptr,
                              const uint8_t* a_ptr,
                              int step,         // bytes per pixel
                              int rgb_stride,   // bytes per scanline
                              float dithering,
                              int use_iterative_conversion,
                              WebPPicture* const picture) {
  int y;
  const int width = picture->width;
  const int height = picture->height;
  const int has_alpha = CheckNonOpaque(a_ptr, width, height, step, rgb_stride);
  const int is_rgb = (r_ptr < b_ptr);  // otherwise it's bgr

  picture->colorspace = has_alpha ? WEBP_YUV420A : WEBP_YUV420;
  picture->use_argb = 0;

  // disable smart conversion if source is too small (overkill).
  if (width < kMinDimensionIterativeConversion ||
      height < kMinDimensionIterativeConversion) {
    use_iterative_conversion = 0;
  }

  if (!WebPPictureAllocYUVA(picture, width, height)) {
    return 0;
  }
  if (has_alpha) {
    assert(step == 4);
#if defined(USE_GAMMA_COMPRESSION) && defined(USE_INVERSE_ALPHA_TABLE)
    assert(kAlphaFix + kGammaFix <= 31);
#endif
  }

  if (use_iterative_conversion) {
    InitGammaTablesS();
    if (!PreprocessARGB(r_ptr, g_ptr, b_ptr, step, rgb_stride, picture)) {
      return 0;
    }
    if (has_alpha) {
      WebPExtractAlpha(a_ptr, rgb_stride, width, height,
                       picture->a, picture->a_stride);
    }
  } else {
    const int uv_width = (width + 1) >> 1;
    int use_dsp = (step == 3);  // use special function in this case
    // temporary storage for accumulated R/G/B values during conversion to U/V
    uint16_t* const tmp_rgb =
        (uint16_t*)WebPSafeMalloc(4 * uv_width, sizeof(*tmp_rgb));
    uint8_t* dst_y = picture->y;
    uint8_t* dst_u = picture->u;
    uint8_t* dst_v = picture->v;
    uint8_t* dst_a = picture->a;

    VP8Random base_rg;
    VP8Random* rg = NULL;
    if (dithering > 0.) {
      VP8InitRandom(&base_rg, dithering);
      rg = &base_rg;
      use_dsp = 0;   // can't use dsp in this case
    }
    WebPInitConvertARGBToYUV();
    InitGammaTables();

    if (tmp_rgb == NULL) return 0;  // malloc error

    // Downsample Y/U/V planes, two rows at a time
    for (y = 0; y < (height >> 1); ++y) {
      int rows_have_alpha = has_alpha;
      if (use_dsp) {
        if (is_rgb) {
          WebPConvertRGB24ToY(r_ptr, dst_y, width);
          WebPConvertRGB24ToY(r_ptr + rgb_stride,
                              dst_y + picture->y_stride, width);
        } else {
          WebPConvertBGR24ToY(b_ptr, dst_y, width);
          WebPConvertBGR24ToY(b_ptr + rgb_stride,
                              dst_y + picture->y_stride, width);
        }
      } else {
        ConvertRowToY(r_ptr, g_ptr, b_ptr, step, dst_y, width, rg);
        ConvertRowToY(r_ptr + rgb_stride,
                      g_ptr + rgb_stride,
                      b_ptr + rgb_stride, step,
                      dst_y + picture->y_stride, width, rg);
      }
      dst_y += 2 * picture->y_stride;
      if (has_alpha) {
        rows_have_alpha &= !WebPExtractAlpha(a_ptr, rgb_stride, width, 2,
                                             dst_a, picture->a_stride);
        dst_a += 2 * picture->a_stride;
      }
      // Collect averaged R/G/B(/A)
      if (!rows_have_alpha) {
        AccumulateRGB(r_ptr, g_ptr, b_ptr, step, rgb_stride, tmp_rgb, width);
      } else {
        AccumulateRGBA(r_ptr, g_ptr, b_ptr, a_ptr, rgb_stride, tmp_rgb, width);
      }
      // Convert to U/V
      if (rg == NULL) {
        WebPConvertRGBA32ToUV(tmp_rgb, dst_u, dst_v, uv_width);
      } else {
        ConvertRowsToUV(tmp_rgb, dst_u, dst_v, uv_width, rg);
      }
      dst_u += picture->uv_stride;
      dst_v += picture->uv_stride;
      r_ptr += 2 * rgb_stride;
      b_ptr += 2 * rgb_stride;
      g_ptr += 2 * rgb_stride;
      if (has_alpha) a_ptr += 2 * rgb_stride;
    }
    if (height & 1) {    // extra last row
      int row_has_alpha = has_alpha;
      if (use_dsp) {
        if (r_ptr < b_ptr) {
          WebPConvertRGB24ToY(r_ptr, dst_y, width);
        } else {
          WebPConvertBGR24ToY(b_ptr, dst_y, width);
        }
      } else {
        ConvertRowToY(r_ptr, g_ptr, b_ptr, step, dst_y, width, rg);
      }
      if (row_has_alpha) {
        row_has_alpha &= !WebPExtractAlpha(a_ptr, 0, width, 1, dst_a, 0);
      }
      // Collect averaged R/G/B(/A)
      if (!row_has_alpha) {
        // Collect averaged R/G/B
        AccumulateRGB(r_ptr, g_ptr, b_ptr, step, /* rgb_stride = */ 0,
                      tmp_rgb, width);
      } else {
        AccumulateRGBA(r_ptr, g_ptr, b_ptr, a_ptr, /* rgb_stride = */ 0,
                       tmp_rgb, width);
      }
      if (rg == NULL) {
        WebPConvertRGBA32ToUV(tmp_rgb, dst_u, dst_v, uv_width);
      } else {
        ConvertRowsToUV(tmp_rgb, dst_u, dst_v, uv_width, rg);
      }
    }
    WebPSafeFree(tmp_rgb);
  }
  return 1;
}